

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test>::CreateTest
          (ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test> *this)

{
  Test *this_00;
  ParameterizedTestFactory<InternalFixupSectionNames_SectionName_Test> *this_local;
  
  WithParamInterface<std::tuple<const_char_*,_pstore::repo::section_kind>_>::SetParam
            (&this->parameter_);
  this_00 = (Test *)operator_new(0x158);
  InternalFixupSectionNames_SectionName_Test::InternalFixupSectionNames_SectionName_Test
            ((InternalFixupSectionNames_SectionName_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }